

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entries.cpp
# Opt level: O0

Data * DL::Expressions::named_func(Data *__return_storage_ptr__,vector_t<Data> *args,VM *vm)

{
  bool bVar1;
  DataType DVar2;
  DataGroup *pDVar3;
  vector_t<Data> *pvVar4;
  allocator local_161;
  string local_160 [39];
  undefined1 local_139;
  reference local_138;
  Data *data;
  const_iterator __end2;
  const_iterator __begin2;
  vector_t<Data> *__range2;
  string local_110 [32];
  undefined1 local_f0 [8];
  DataGroup grp;
  string local_d8 [32];
  undefined4 local_b8;
  allocator local_b1;
  string local_b0 [48];
  undefined1 local_80 [8];
  Data d;
  VM *vm_local;
  vector_t<Data> *args_local;
  Data *r;
  
  d._88_8_ = vm;
  union_func((Data *)local_80,args,vm);
  DVar2 = Data::type((Data *)local_80);
  if (DVar2 == DT_Group) {
    pDVar3 = Data::getGroup((Data *)local_80);
    pvVar4 = DataGroup::getNamedEntries(pDVar3);
    bVar1 = std::vector<DL::Data,_std::allocator<DL::Data>_>::empty(pvVar4);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_d8,"",
                 (allocator *)
                 ((long)&grp.mShared.
                         super___shared_ptr<DL::DataInternal,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 7));
      Data::Data(__return_storage_ptr__,(string_t *)local_d8);
      std::__cxx11::string::~string(local_d8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&grp.mShared.
                         super___shared_ptr<DL::DataInternal,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 7));
      local_b8 = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_110,"",(allocator *)((long)&__range2 + 7));
      DataGroup::DataGroup((DataGroup *)local_f0,(string_t *)local_110);
      std::__cxx11::string::~string(local_110);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
      pDVar3 = Data::getGroup((Data *)local_80);
      pvVar4 = DataGroup::getNamedEntries(pDVar3);
      __end2 = std::vector<DL::Data,_std::allocator<DL::Data>_>::begin(pvVar4);
      data = (Data *)std::vector<DL::Data,_std::allocator<DL::Data>_>::end(pvVar4);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_DL::Data_*,_std::vector<DL::Data,_std::allocator<DL::Data>_>_>
                                         *)&data), bVar1) {
        local_138 = __gnu_cxx::
                    __normal_iterator<const_DL::Data_*,_std::vector<DL::Data,_std::allocator<DL::Data>_>_>
                    ::operator*(&__end2);
        DataGroup::add((DataGroup *)local_f0,local_138);
        __gnu_cxx::
        __normal_iterator<const_DL::Data_*,_std::vector<DL::Data,_std::allocator<DL::Data>_>_>::
        operator++(&__end2);
      }
      local_139 = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_160,"",&local_161);
      Data::Data(__return_storage_ptr__,(string_t *)local_160);
      std::__cxx11::string::~string(local_160);
      std::allocator<char>::~allocator((allocator<char> *)&local_161);
      Data::setGroup(__return_storage_ptr__,(DataGroup *)local_f0);
      local_b8 = 1;
      local_139 = 1;
      DataGroup::~DataGroup((DataGroup *)local_f0);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"",&local_b1);
    Data::Data(__return_storage_ptr__,(string_t *)local_b0);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    local_b8 = 1;
  }
  Data::~Data((Data *)local_80);
  return __return_storage_ptr__;
}

Assistant:

Data named_func(const vector_t<Data>& args, VM& vm)
{
	Data d = union_func(args, vm);

	if (d.type() != DT_Group)
		return Data();

	if (d.getGroup().getNamedEntries().empty())
		return Data();

	DataGroup grp;
	for (const Data& data : d.getGroup().getNamedEntries())
		grp.add(data);

	Data r;
	r.setGroup(grp);
	return r;
}